

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

CAmount __thiscall wallet::SelectionResult::GetSelectedEffectiveValue(SelectionResult *this)

{
  long lVar1;
  CAmount CVar2;
  _Base_ptr p_Var3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = 0;
  for (p_Var3 = (this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    CVar2 = COutput::GetEffectiveValue(*(COutput **)(p_Var3 + 1));
    lVar4 = lVar4 + CVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return lVar4 + this->bump_fee_group_discount;
  }
  __stack_chk_fail();
}

Assistant:

CAmount SelectionResult::GetSelectedEffectiveValue() const
{
    return std::accumulate(m_selected_inputs.cbegin(), m_selected_inputs.cend(), CAmount{0}, [](CAmount sum, const auto& coin) { return sum + coin->GetEffectiveValue(); }) + bump_fee_group_discount;
}